

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationXX.hpp
# Opt level: O1

RotationXX<std::complex<float>_> *
qclab::qgates::operator/
          (RotationXX<std::complex<float>_> *__return_storage_ptr__,
          RotationXX<std::complex<float>_> *lhs,RotationXX<std::complex<float>_> *rhs)

{
  float fVar1;
  float fVar2;
  angle_type aVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  iVar5 = (lhs->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems[0];
  iVar4 = (*(rhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar5 != iVar4) {
    __assert_fail("lhs.qubit() == rhs.qubit()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationXX.hpp"
                  ,0xd2,
                  "RotationXX<T> qclab::qgates::operator/(RotationXX<T>, const RotationXX<T> &)");
  }
  iVar5 = (*(lhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(lhs);
  iVar4 = (*(rhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar5 == iVar4) {
    aVar3 = (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_;
    fVar6 = aVar3.cos_;
    fVar7 = aVar3.sin_;
    fVar1 = (rhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_.cos_;
    fVar2 = (rhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_.sin_;
    (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_.cos_ =
         fVar6 * fVar1 + fVar7 * fVar2;
    (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_.sin_ =
         fVar7 * fVar1 - fVar2 * fVar6;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).
    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00523ce8;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).super_QAdjustable.fixed_ =
         (lhs->super_QRotationGate2<std::complex<float>_>).super_QAdjustable.fixed_;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).
    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00523c60;
    aVar3 = (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_;
    *(undefined8 *)
     (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems =
         *(undefined8 *)(lhs->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).rotation_.angle_ = aVar3;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).
    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00523b88;
    return __return_storage_ptr__;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationXX.hpp"
                ,0xc2,
                "RotationXX<T> &qclab::qgates::RotationXX<std::complex<float>>::operator/=(const RotationXX<T> &) [T = std::complex<float>]"
               );
}

Assistant:

RotationXX< T > operator/( RotationXX< T > lhs ,
                                         const RotationXX< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }